

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>::validation_not_equal_error
          (validation_not_equal_error<intel_acbp_v1_t::structure_ids_t> *this,
          structure_ids_t *expected,structure_ids_t *actual,kstream *io,string *src_path)

{
  allocator local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"not equal",&local_69);
  std::__cxx11::string::string((string *)&local_68,(string *)src_path);
  validation_failed_error::validation_failed_error
            (&this->super_validation_failed_error,&local_48,io,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_validation_failed_error).super_kstruct_error =
       &PTR__kstruct_error_001815a8;
  this->m_expected = expected;
  this->m_actual = actual;
  return;
}

Assistant:

validation_not_equal_error<T>(const T& expected, const T& actual, kstream* io, const std::string src_path):
        validation_failed_error("not equal", io, src_path),
        m_expected(expected),
        m_actual(actual)
    {
    }